

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_> *
despot::logging::InitializeLogStreams(void)

{
  pointer pplVar1;
  log_ostream *plVar2;
  value_type *__val;
  vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_> *in_RDI;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pplVar1 = (pointer)operator_new(0x30);
  (in_RDI->super__Vector_base<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>).
  _M_impl.super__Vector_impl_data._M_start = pplVar1;
  (in_RDI->super__Vector_base<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = pplVar1 + 6;
  pplVar1[1] = (log_ostream *)0x0;
  pplVar1[2] = (log_ostream *)0x0;
  pplVar1[3] = (log_ostream *)0x0;
  pplVar1[4] = (log_ostream *)0x0;
  pplVar1[5] = (log_ostream *)0x0;
  (in_RDI->super__Vector_base<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = pplVar1 + 6;
  *pplVar1 = (log_ostream *)0x0;
  plVar2 = (log_ostream *)operator_new(0x1a0);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,DAT_00193550,DAT_00193558 + DAT_00193550);
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_48);
  pplVar1[1] = plVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  plVar2 = (log_ostream *)operator_new(0x1a0);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,DAT_00193570,DAT_00193578 + DAT_00193570);
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_68);
  pplVar1[2] = plVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  plVar2 = (log_ostream *)operator_new(0x1a0);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,DAT_00193590,DAT_00193598 + DAT_00193590);
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_88);
  pplVar1[3] = plVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  plVar2 = (log_ostream *)operator_new(0x1a0);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,DAT_001935b0,DAT_001935b8 + DAT_001935b0);
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_a8);
  pplVar1[4] = plVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  plVar2 = (log_ostream *)operator_new(0x1a0);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,DAT_001935d0,DAT_001935d8 + DAT_001935d0);
  log_ostream::log_ostream(plVar2,(ostream *)&std::cerr,&local_c8);
  pplVar1[5] = plVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

vector<log_ostream*> logging::InitializeLogStreams() {
	vector<log_ostream*> streams(6);

	streams[NONE] = NULL;
	streams[ERROR] = new log_ostream(cerr, markers_[ERROR]);
	streams[WARN] = new log_ostream(cerr, markers_[WARN]);
	streams[INFO] = new log_ostream(cerr, markers_[INFO]);
	streams[DEBUG] = new log_ostream(cerr, markers_[DEBUG]);
	streams[VERBOSE] = new log_ostream(cerr, markers_[VERBOSE]);

	return streams;
}